

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O1

SerialArena * __thiscall google::protobuf::internal::ArenaImpl::GetSerialArena(ArenaImpl *this)

{
  void *pvVar1;
  ulong uVar2;
  SerialArena *pSVar3;
  undefined8 *puVar4;
  __pointer_type pSVar5;
  __pointer_type pSVar6;
  size_t sVar7;
  long *in_FS_OFFSET;
  bool bVar8;
  
  pvVar1 = (void *)(*in_FS_OFFSET + -0x10);
  if (in_FS_OFFSET[-2] == this->lifecycle_id_) {
    bVar8 = true;
    pSVar3 = (SerialArena *)in_FS_OFFSET[-1];
  }
  else {
    pSVar3 = (this->hint_)._M_b._M_p;
    if (pSVar3 == (SerialArena *)0x0) {
      bVar8 = false;
    }
    else {
      bVar8 = pSVar3->owner_ == pvVar1;
    }
  }
  if (bVar8) {
    return pSVar3;
  }
  for (pSVar3 = (this->threads_)._M_b._M_p; pSVar3 != (SerialArena *)0x0; pSVar3 = pSVar3->next_) {
    if (pSVar3->owner_ == pvVar1) goto LAB_0027cbe1;
  }
  uVar2 = (this->options_).start_block_size;
  sVar7 = 0x60;
  if (0x60 < uVar2) {
    sVar7 = uVar2;
  }
  puVar4 = (undefined8 *)(*(this->options_).block_alloc)(sVar7);
  *puVar4 = 0;
  puVar4[1] = 0x18;
  puVar4[2] = sVar7;
  LOCK();
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i =
       (this->space_allocated_).super___atomic_base<unsigned_long>._M_i + sVar7;
  UNLOCK();
  pSVar3 = (SerialArena *)(puVar4 + 3);
  puVar4[1] = 0x60;
  puVar4[3] = this;
  puVar4[4] = pvVar1;
  puVar4[5] = puVar4;
  puVar4[8] = puVar4 + 0xc;
  puVar4[9] = puVar4[2] + (long)puVar4;
  puVar4[6] = 0;
  puVar4[10] = 0;
  puVar4[0xb] = 0;
  pSVar6 = (this->threads_)._M_b._M_p;
  do {
    puVar4[7] = pSVar6;
    LOCK();
    pSVar5 = (this->threads_)._M_b._M_p;
    bVar8 = pSVar6 == pSVar5;
    if (bVar8) {
      (this->threads_)._M_b._M_p = pSVar3;
      pSVar5 = pSVar6;
    }
    UNLOCK();
    pSVar6 = pSVar5;
  } while (!bVar8);
LAB_0027cbe1:
  in_FS_OFFSET[-1] = (long)pSVar3;
  in_FS_OFFSET[-2] = this->lifecycle_id_;
  (this->hint_)._M_b._M_p = pSVar3;
  return pSVar3;
}

Assistant:

static ThreadCache& thread_cache() { return thread_cache_; }